

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O1

void __thiscall Enterprise::Nick::run_for(Nick *this,Cycles duration)

{
  uint16_t *puVar1;
  long lVar2;
  bool bVar3;
  uint8_t *puVar4;
  ScanTarget *pSVar5;
  OutputType type;
  short sVar6;
  uint16_t uVar7;
  int iVar8;
  WrappedInt<Cycles> WVar9;
  undefined4 extraout_var;
  ulong uVar10;
  byte bVar11;
  uint8_t uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  Mode MVar20;
  uint16_t *puVar21;
  int iVar22;
  long lVar23;
  WrappedInt<Cycles> WVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  
  if (duration.super_WrappedInt<Cycles>.length_ != 0) {
    WVar9.length_ = 0x7fffffff;
    if ((long)duration.super_WrappedInt<Cycles>.length_ < 0x7fffffff) {
      WVar9 = duration.super_WrappedInt<Cycles>.length_;
    }
    WVar24.length_ = 0xffffffff80000000;
    if (-0x80000000 < WVar9.length_) {
      WVar24.length_ = WVar9.length_;
    }
    puVar1 = this->palette_;
    do {
      uVar13 = this->horizontal_counter_;
      iVar22 = (int)WVar24.length_;
      iVar25 = 0x390 - uVar13;
      if (iVar22 <= (int)(0x390 - uVar13)) {
        iVar25 = iVar22;
      }
      iVar16 = (int)uVar13 >> 4;
      iVar18 = (int)(iVar25 + uVar13) >> 4;
      this->horizontal_counter_ = (int)(iVar25 + uVar13) % 0x390;
      if (iVar16 != iVar18) {
        if (uVar13 < 0x10) {
          set_output_type(this,Sync,false);
          if (this->left_margin_ == 0) {
            this->is_sync_or_pixels_ = true;
          }
          if (this->right_margin_ == 0) {
            this->is_sync_or_pixels_ = false;
          }
        }
        this->last_read_ = 0xff;
        iVar27 = 4;
        if (iVar18 < 4) {
          iVar27 = iVar18;
        }
        iVar26 = iVar16;
        if (iVar16 < iVar27) {
          bVar3 = this->should_reload_line_parameters_;
          puVar4 = this->ram_;
          uVar10 = (ulong)this->line_parameter_pointer_;
          iVar19 = iVar16;
          do {
            if (bVar3 == false) goto switchD_0034335e_default;
            switch(iVar19) {
            case 0:
              this->lines_remaining_ = puVar4[uVar10];
              this->last_read_ = puVar4[uVar10 + 1];
              this->interrupt_line_ = (bool)(puVar4[uVar10 + 1] >> 7);
              MVar20 = puVar4[uVar10 + 1] >> 1 & LPixel;
              this->mode_ = MVar20;
              bVar11 = puVar4[uVar10 + 1] >> 5 & 3;
              this->bpp_ = 1 << bVar11;
              if (MVar20 - CH256 < 3) {
LAB_003433cd:
                this->column_size_ = 8 >> bVar11;
                this->line_data_per_column_increments_[0] = 1;
                this->line_data_per_column_increments_[1] = 0;
              }
              else if (MVar20 == Attr) {
                this->column_size_ = 8;
                this->line_data_per_column_increments_[0] = 1;
                this->line_data_per_column_increments_[1] = 1;
              }
              else {
                if (MVar20 == LPixel) goto LAB_003433cd;
                this->column_size_ = 0x10 >> bVar11;
                this->line_data_per_column_increments_[0] = 2;
                this->line_data_per_column_increments_[1] = 0;
              }
              this->vres_ = (bool)(puVar4[uVar10 + 1] >> 4 & 1);
              this->reload_line_parameter_pointer_ = (bool)(puVar4[uVar10 + 1] & 1);
              break;
            case 1:
              this->left_margin_ = puVar4[uVar10 + 2] & 0x3f;
              this->right_margin_ = puVar4[uVar10 + 3] & 0x3f;
              this->last_read_ = puVar4[uVar10 + 3];
              MVar20 = this->mode_;
              if (MVar20 - CH256 < 3) {
                bVar11 = puVar4[uVar10 + 3];
                this->alt_ind_palettes[0] = puVar1;
                puVar21 = (uint16_t *)((ulong)(bVar11 >> 4 & 4) + (long)puVar1);
                this->alt_ind_palettes[2] = puVar21;
                uVar13 = bVar11 >> 4 & 0xfffffff8;
              }
              else {
                if ((MVar20 != LPixel) && (MVar20 != Pixel)) break;
                bVar11 = -((char)puVar4[uVar10 + 2] >> 7);
                uVar13 = puVar4[uVar10 + 2] & 0x40;
                this->two_colour_mask_ = ~(bVar11 + (char)uVar13 * '\x02');
                this->alt_ind_palettes[0] = puVar1;
                puVar21 = puVar1 + (ulong)bVar11 * 2;
                this->alt_ind_palettes[2] = puVar21;
                uVar13 = uVar13 >> 3;
              }
              this->alt_ind_palettes[1] = (uint16_t *)((long)puVar1 + (ulong)uVar13);
              this->alt_ind_palettes[3] = (uint16_t *)((long)puVar21 + (ulong)uVar13);
              break;
            case 2:
              bVar11 = puVar4[uVar10 + 4];
              this->start_line_data_pointer_[0] = (ushort)bVar11;
              uVar7 = CONCAT11(puVar4[uVar10 + 5],bVar11);
              this->start_line_data_pointer_[0] = uVar7;
              this->line_data_pointer_[0] = uVar7;
              uVar12 = puVar4[uVar10 + 5];
              goto LAB_00343466;
            case 3:
              bVar11 = puVar4[uVar10 + 6];
              this->start_line_data_pointer_[1] = (ushort)bVar11;
              uVar7 = CONCAT11(puVar4[uVar10 + 7],bVar11);
              this->start_line_data_pointer_[1] = uVar7;
              this->line_data_pointer_[1] = uVar7;
              uVar12 = puVar4[uVar10 + 7];
LAB_00343466:
              this->last_read_ = uVar12;
            }
switchD_0034335e_default:
            this->output_duration_ = this->output_duration_ + 1;
            this->line_data_pointer_[0] =
                 this->line_data_pointer_[0] +
                 (short)this->line_data_per_column_increments_[0] * (ushort)this->is_sync_or_pixels_
            ;
            this->line_data_pointer_[1] =
                 this->line_data_pointer_[1] +
                 (ushort)this->is_sync_or_pixels_ * (short)this->line_data_per_column_increments_[1]
            ;
            iVar19 = iVar19 + 1;
            if (iVar19 == this->left_margin_) {
              this->is_sync_or_pixels_ = true;
            }
            if (iVar19 == this->right_margin_) {
              this->is_sync_or_pixels_ = false;
            }
            iVar26 = iVar27;
          } while (iVar27 != iVar19);
        }
        if (iVar26 == 4) {
          type = this->is_sync_or_pixels_ ^ Blank;
          if (this->mode_ != Vsync) {
            type = Blank;
          }
          set_output_type(this,type,false);
        }
        if (this->mode_ == Vsync) {
          iVar16 = iVar26;
          if (iVar26 < iVar18 && 3 < iVar26) {
            do {
              iVar27 = this->left_margin_;
              iVar26 = iVar18;
              if (iVar27 < iVar18) {
                iVar26 = iVar27;
              }
              if (iVar27 <= iVar16) {
                iVar26 = iVar18;
              }
              iVar19 = this->right_margin_;
              iVar8 = iVar19;
              if (iVar26 <= iVar19) {
                iVar8 = iVar26;
              }
              if (iVar16 < iVar19) {
                iVar26 = iVar8;
              }
              this->output_duration_ = this->output_duration_ + (iVar26 - iVar16);
              sVar6 = (ushort)this->is_sync_or_pixels_ * (short)(iVar26 - iVar16);
              this->line_data_pointer_[0] =
                   this->line_data_pointer_[0] +
                   (short)this->line_data_per_column_increments_[0] * sVar6;
              this->line_data_pointer_[1] =
                   this->line_data_pointer_[1] +
                   sVar6 * (short)this->line_data_per_column_increments_[1];
              if ((iVar26 == iVar27 || iVar26 == iVar19) && iVar26 != 0x39) {
                this->is_sync_or_pixels_ = iVar26 == 0x39 || iVar26 != iVar19;
              }
              set_output_type(this,this->is_sync_or_pixels_ ^ Blank,false);
              iVar16 = iVar26;
            } while (iVar26 < iVar18);
          }
        }
        else {
          iVar27 = this->first_pixel_window_;
          bVar3 = iVar26 < iVar27;
          if (iVar26 < iVar18 && iVar26 < iVar27) {
            iVar26 = 4;
            if (iVar18 < 4) {
              iVar26 = iVar18;
            }
            if (iVar26 <= iVar16) {
              iVar26 = iVar16;
            }
            iVar16 = iVar26 * 2;
            lVar2 = (long)iVar16 * 2;
            lVar14 = (long)iVar16 + 1;
            lVar17 = 0;
            do {
              lVar23 = iVar26 + lVar17;
              if (lVar23 == 6) {
                set_output_type(this,ColourBurst,false);
              }
              if ((lVar23 < 8) && (this->should_reload_line_parameters_ != false)) {
                if (0xe < iVar16) {
                  __assert_fail("base < 7",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                                ,0x131,"void Enterprise::Nick::run_for(Cycles)");
                }
                puVar4 = this->ram_;
                uVar7 = anon_unknown.dwarf_c71d51::mapped_colour
                                  (puVar4[(int)((uint)this->line_parameter_pointer_ + iVar16)]);
                *(uint16_t *)
                 ((long)this->line_data_per_column_increments_ + lVar17 * 4 + lVar2 + 0x14) = uVar7;
                uVar7 = anon_unknown.dwarf_c71d51::mapped_colour
                                  (puVar4[lVar17 * 2 + lVar14 + (ulong)this->line_parameter_pointer_
                                         ]);
                *(uint16_t *)
                 ((long)this->line_data_per_column_increments_ + lVar17 * 4 + lVar2 + 0x16) = uVar7;
                this->last_read_ =
                     puVar4[lVar17 * 2 + lVar14 + (ulong)this->line_parameter_pointer_];
              }
              this->output_duration_ = this->output_duration_ + 1;
              this->line_data_pointer_[0] =
                   this->line_data_pointer_[0] +
                   (short)this->line_data_per_column_increments_[0] *
                   (ushort)this->is_sync_or_pixels_;
              this->line_data_pointer_[1] =
                   this->line_data_pointer_[1] +
                   (ushort)this->is_sync_or_pixels_ *
                   (short)this->line_data_per_column_increments_[1];
              lVar15 = lVar17 + 1 + (long)iVar26;
              if ((lVar23 != 0x38) && ((int)lVar15 == this->left_margin_)) {
                this->is_sync_or_pixels_ = true;
              }
              if ((lVar23 != 0x38) && (iVar26 + (int)lVar17 + 1 == this->right_margin_)) {
                this->is_sync_or_pixels_ = false;
              }
              iVar27 = this->first_pixel_window_;
              bVar3 = lVar15 < iVar27;
              lVar17 = lVar17 + 1;
            } while ((lVar15 < iVar18) && (iVar16 = iVar16 + 2, lVar15 < iVar27));
            iVar26 = iVar26 + (int)lVar17;
          }
          if (!bVar3) {
            if (iVar26 == iVar27) {
              set_output_type(this,this->is_sync_or_pixels_ ^ Border,false);
            }
            while (iVar26 < iVar18) {
              iVar16 = this->left_margin_;
              iVar27 = iVar18;
              if (iVar16 < iVar18) {
                iVar27 = iVar16;
              }
              iVar19 = this->right_margin_;
              if (iVar16 <= iVar26) {
                iVar27 = iVar18;
              }
              iVar8 = iVar27;
              if (iVar19 < iVar27) {
                iVar8 = iVar19;
              }
              if (iVar19 <= iVar26) {
                iVar8 = iVar27;
              }
              iVar27 = iVar8 - iVar26;
              if (this->is_sync_or_pixels_ == true) {
                while (iVar27 != 0) {
                  if (this->pixel_pointer_ == (uint16_t *)0x0) {
                    if (this->output_duration_ != 0) {
                      set_output_type(this,Pixels,true);
                    }
                    pSVar5 = (this->crt_).scan_target_;
                    iVar16 = (*pSVar5->_vptr_ScanTarget[5])(pSVar5,0x150,1);
                    puVar21 = (uint16_t *)CONCAT44(extraout_var,iVar16);
                    (this->crt_).allocated_data_length_ =
                         -(ulong)(puVar21 == (uint16_t *)0x0) | 0x150;
                    this->allocated_pointer_ = puVar21;
                    this->pixel_pointer_ = puVar21;
                  }
                  if (this->allocated_pointer_ == (uint16_t *)0x0) {
                    this->output_duration_ = this->output_duration_ + iVar27;
                    sVar6 = (ushort)this->is_sync_or_pixels_ * (short)iVar27;
                    this->line_data_pointer_[0] =
                         this->line_data_pointer_[0] +
                         (short)this->line_data_per_column_increments_[0] * sVar6;
                    this->line_data_pointer_[1] =
                         this->line_data_pointer_[1] +
                         sVar6 * (short)this->line_data_per_column_increments_[1];
                    iVar26 = iVar26 + iVar27;
                    if ((iVar26 != 0x39) && (iVar26 == this->left_margin_)) {
                      this->is_sync_or_pixels_ = true;
                    }
                    iVar27 = 0;
                  }
                  else {
                    puVar21 = this->pixel_pointer_;
                    uVar10 = (ulong)((long)this->allocated_pointer_ + (0x2a0 - (long)puVar21)) >> 1;
                    iVar16 = (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                         uVar10 & 0xffffffff) / (long)this->column_size_);
                    if (iVar27 <= iVar16) {
                      iVar16 = iVar27;
                    }
                    switch(this->mode_) {
                    case Attr:
                      iVar19 = this->bpp_;
                      if (iVar19 == 2) {
                        output_attributed<2>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 4) {
                        output_attributed<4>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 8) {
                        output_attributed<8>(this,puVar21,iVar16);
                      }
                      else {
                        output_attributed<1>(this,puVar21,iVar16);
                      }
                      break;
                    case CH256:
                      iVar19 = this->bpp_;
                      if (iVar19 == 2) {
                        output_character<2,8>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 4) {
                        output_character<4,8>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 8) {
                        output_character<8,8>(this,puVar21,iVar16);
                      }
                      else {
                        output_character<1,8>(this,puVar21,iVar16);
                      }
                      break;
                    case CH128:
                      iVar19 = this->bpp_;
                      if (iVar19 == 2) {
                        output_character<2,7>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 4) {
                        output_character<4,7>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 8) {
                        output_character<8,7>(this,puVar21,iVar16);
                      }
                      else {
                        output_character<1,7>(this,puVar21,iVar16);
                      }
                      break;
                    case CH64:
                      iVar19 = this->bpp_;
                      if (iVar19 == 2) {
                        output_character<2,6>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 4) {
                        output_character<4,6>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 8) {
                        output_character<8,6>(this,puVar21,iVar16);
                      }
                      else {
                        output_character<1,6>(this,puVar21,iVar16);
                      }
                      break;
                    default:
                      iVar19 = this->bpp_;
                      if (iVar19 == 2) {
                        output_pixel<2,false>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 4) {
                        output_pixel<4,false>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 8) {
                        output_pixel<8,false>(this,puVar21,iVar16);
                      }
                      else {
                        output_pixel<1,false>(this,puVar21,iVar16);
                      }
                      break;
                    case LPixel:
                      iVar19 = this->bpp_;
                      if (iVar19 == 2) {
                        output_pixel<2,true>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 4) {
                        output_pixel<4,true>(this,puVar21,iVar16);
                      }
                      else if (iVar19 == 8) {
                        output_pixel<8,true>(this,puVar21,iVar16);
                      }
                      else {
                        output_pixel<1,true>(this,puVar21,iVar16);
                      }
                    }
                    puVar21 = this->pixel_pointer_;
                    this->pixel_pointer_ = puVar21 + (long)iVar16 * (long)this->column_size_;
                    this->output_duration_ = this->output_duration_ + iVar16;
                    if ((long)(puVar21 + (long)iVar16 * (long)this->column_size_) -
                        (long)this->allocated_pointer_ == 0x2a0) {
                      set_output_type(this,Pixels,true);
                    }
                    sVar6 = (ushort)this->is_sync_or_pixels_ * (short)iVar16;
                    this->line_data_pointer_[0] =
                         this->line_data_pointer_[0] +
                         (short)this->line_data_per_column_increments_[0] * sVar6;
                    this->line_data_pointer_[1] =
                         this->line_data_pointer_[1] +
                         sVar6 * (short)this->line_data_per_column_increments_[1];
                    iVar26 = iVar26 + iVar16;
                    if ((iVar26 != 0x39) && (iVar26 == this->left_margin_)) {
                      this->is_sync_or_pixels_ = true;
                    }
                    iVar27 = iVar27 - iVar16;
                  }
                  if ((iVar26 != 0x39) && (iVar26 == this->right_margin_)) {
                    this->is_sync_or_pixels_ = false;
                  }
                }
              }
              else {
                this->output_duration_ = this->output_duration_ + iVar27;
                sVar6 = (ushort)this->is_sync_or_pixels_ * (short)iVar27;
                this->line_data_pointer_[0] =
                     this->line_data_pointer_[0] +
                     (short)this->line_data_per_column_increments_[0] * sVar6;
                this->line_data_pointer_[1] =
                     this->line_data_pointer_[1] +
                     sVar6 * (short)this->line_data_per_column_increments_[1];
                if (iVar8 == iVar16 && iVar8 != 0x39) {
                  this->is_sync_or_pixels_ = true;
                }
                iVar26 = 0x39;
                if ((iVar8 != 0x39) && (iVar26 = iVar8, iVar8 == iVar19)) {
                  this->is_sync_or_pixels_ = false;
                }
              }
              set_output_type(this,this->is_sync_or_pixels_ ^ Border,false);
            }
          }
        }
        if (this->horizontal_counter_ == 0) {
          if (iVar26 != 0x39) {
            __assert_fail("window == 57",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                          ,0x18e,"void Enterprise::Nick::run_for(Cycles)");
          }
          puVar4 = &this->lines_remaining_;
          *puVar4 = *puVar4 + '\x01';
          if (*puVar4 == '\0') {
            this->should_reload_line_parameters_ = true;
            if (this->reload_line_parameter_pointer_ == true) {
              this->line_parameter_pointer_ = this->line_parameter_base_;
            }
            else {
              this->line_parameter_pointer_ = this->line_parameter_pointer_ + 0x10;
            }
          }
          else {
            this->should_reload_line_parameters_ = false;
          }
          MVar20 = this->mode_;
          if (MVar20 < 8) {
            if ((0x38U >> (MVar20 & 0x1f) & 1) == 0) {
              if (((0x86U >> (MVar20 & 0x1f) & 1) != 0) && (this->vres_ == false)) {
                this->line_data_pointer_[0] = this->start_line_data_pointer_[0];
              }
            }
            else {
              this->line_data_pointer_[0] = this->start_line_data_pointer_[0];
              this->line_data_pointer_[1] = this->line_data_pointer_[1] + 1;
            }
          }
        }
      }
      WVar24.length_ = (IntType)(uint)(iVar22 - iVar25);
    } while (iVar22 - iVar25 != 0);
  }
  return;
}

Assistant:

void Nick::run_for(Cycles duration) {
	constexpr int line_length = 912;

#define add_window(x)															\
	line_data_pointer_[0] += is_sync_or_pixels_ * line_data_per_column_increments_[0] * (x);	\
	line_data_pointer_[1] += is_sync_or_pixels_ * line_data_per_column_increments_[1] * (x);	\
	window += x;																\
	if(window != 57 && window == left_margin_) is_sync_or_pixels_ = true;		\
	if(window != 57 && window == right_margin_) is_sync_or_pixels_ = false;

	int clocks_remaining = duration.as<int>();
	while(clocks_remaining) {
		// Determine how many cycles are left this line.
		const int clocks_this_line = std::min(clocks_remaining, line_length - horizontal_counter_);

		// Convert that into a [start/current] and end window.
		int window = horizontal_counter_ >> 4;
		const int end_window = (horizontal_counter_ + clocks_this_line) >> 4;

		// Advance the line counters.
		clocks_remaining -= clocks_this_line;
		horizontal_counter_ = (horizontal_counter_ + clocks_this_line) % line_length;

		// Do nothing if a window boundary isn't crossed.
		if(window == end_window) continue;

		// HSYNC is signalled for four windows at the start of the line.
		// I currently believe this happens regardless of Vsync mode.
		if(!window) {
			set_output_type(OutputType::Sync);

			// There's no increment to get to 0, it happens when the horizontal_counter_
			// is reset. So test for active bit effect manually.
			if(!left_margin_) is_sync_or_pixels_ = true;
			if(!right_margin_) is_sync_or_pixels_ = false;
		}

		// Default to noting read.
		last_read_ = 0xff;

		while(window < 4 && window < end_window) {
			if(should_reload_line_parameters_) {
				switch(window) {
					// First slot: line count, mode and interrupt flag.
					case 0:
						// Byte 0: lines remaining.
						lines_remaining_ = ram_[line_parameter_pointer_];

						// Byte 1: current interrupt output plus graphics modes...
						last_read_ = ram_[line_parameter_pointer_ + 1];

						// Set the new interrupt line output.
						interrupt_line_ = ram_[line_parameter_pointer_ + 1] & 0x80;

						// Determine the mode and depth, and hence the column size.
						mode_ = Mode((ram_[line_parameter_pointer_ + 1] >> 1)&7);
						bpp_ = 1 << ((ram_[line_parameter_pointer_ + 1] >> 5)&3);
						switch(mode_) {
							default:
							case Mode::Pixel:
								column_size_ = 16 / bpp_;
								line_data_per_column_increments_[0] = 2;
								line_data_per_column_increments_[1] = 0;
							break;

							case Mode::LPixel:
							case Mode::CH64:
							case Mode::CH128:
							case Mode::CH256:
								column_size_ = 8 / bpp_;
								line_data_per_column_increments_[0] = 1;
								line_data_per_column_increments_[1] = 0;
							break;

							case Mode::Attr:
								column_size_ = 8;
								line_data_per_column_increments_[0] = 1;
								line_data_per_column_increments_[1] = 1;
							break;
						}

						vres_ = ram_[line_parameter_pointer_ + 1] & 0x10;
						reload_line_parameter_pointer_ = ram_[line_parameter_pointer_ + 1] & 0x01;
					break;

					// Second slot: margins and ALT/IND bits.
					case 1:
						// Determine the margins.
						left_margin_ = ram_[line_parameter_pointer_ + 2] & 0x3f;
						right_margin_ = ram_[line_parameter_pointer_ + 3] & 0x3f;
						last_read_ = ram_[line_parameter_pointer_ + 3];

						// Set up the alternative palettes,
						switch(mode_) {
							default:
							break;

							// NB: LSBALT/MSBALT and ALTIND0/ALTIND1 appear to have opposite effects on palette selection.

							case Mode::Pixel:
							case Mode::LPixel: {
								const uint8_t flags = ram_[line_parameter_pointer_ + 2];

								// Use MSBALT and LSBALT to pick the alt_ind_palettes.
								//
								// LSBALT = b6 of params[2], if set => character codes with bit 6 set should use palette indices 4... instead of 0... .
								// MSBALT = b7 of params[2], if set => character codes with bit 7 set should use palette indices 2 and 3.
								two_colour_mask_ = 0xff &~ (((flags&0x80) >> 7) | ((flags&0x40) << 1));

								alt_ind_palettes[0] = palette_;
								alt_ind_palettes[2] = alt_ind_palettes[0] + ((flags & 0x80) ? 2 : 0);

								alt_ind_palettes[1] = alt_ind_palettes[0] + ((flags & 0x40) ? 4 : 0);
								alt_ind_palettes[3] = alt_ind_palettes[2] + ((flags & 0x40) ? 4 : 0);
							} break;

							case Mode::CH64:
							case Mode::CH128:
							case Mode::CH256: {
								const uint8_t flags = ram_[line_parameter_pointer_ + 3];

								// Use ALTIND0 and ALTIND1 to pick the alt_ind_palettes.
								//
								// ALTIND1 = b6 of params[3], if set => character codes with bit 7 set should use palette indices 2 and 3.
								// ALTIND0 = b7 of params[3], if set => character codes with bit 6 set should use palette indices 4... instead of 0... .
								alt_ind_palettes[0] = palette_;
								alt_ind_palettes[2] = alt_ind_palettes[0] + ((flags & 0x40) ? 2 : 0);

								alt_ind_palettes[1] = alt_ind_palettes[0] + ((flags & 0x80) ? 4 : 0);
								alt_ind_palettes[3] = alt_ind_palettes[2] + ((flags & 0x80) ? 4 : 0);
							} break;
						}
					break;

					// Third slot: Line data pointer 1.
					case 2:
						start_line_data_pointer_[0] = ram_[line_parameter_pointer_ + 4];
						start_line_data_pointer_[0] |= ram_[line_parameter_pointer_ + 5] << 8;

						line_data_pointer_[0] = start_line_data_pointer_[0];
						last_read_ = ram_[line_parameter_pointer_ + 5];
					break;

					// Fourth slot: Line data pointer 2.
					case 3:
						start_line_data_pointer_[1] = ram_[line_parameter_pointer_ + 6];
						start_line_data_pointer_[1] |= ram_[line_parameter_pointer_ + 7] << 8;

						line_data_pointer_[1] = start_line_data_pointer_[1];
						last_read_ = ram_[line_parameter_pointer_ + 7];
					break;
				}
			}

			++output_duration_;
			add_window(1);
		}
		if(window == 4) {
			if(mode_ == Mode::Vsync) {
				set_output_type(is_sync_or_pixels_ ? OutputType::Sync : OutputType::Blank);
			} else {
				set_output_type(OutputType::Blank);
			}
		}

		// Deal with vsync mode out here.
		if(mode_ == Mode::Vsync) {
			if(window >= 4) {
				while(window < end_window) {
					// Skip straight to the next event.
					int next_event = end_window;
					if(window < left_margin_) next_event = std::min(next_event, left_margin_);
					if(window < right_margin_) next_event = std::min(next_event, right_margin_);

					output_duration_ += next_event - window;
					add_window(next_event - window);
					set_output_type(is_sync_or_pixels_ ? OutputType::Sync : OutputType::Blank);
				}
			}
		} else {
			// If present then the colour burst is output for the period from
			// the start of window 6 to the end of window 10.
			//
			// The first 8 palette entries also need to be fetched here.
			while(window < first_pixel_window_ && window < end_window) {
				if(window == 6) {
					set_output_type(OutputType::ColourBurst);
				}

				if(should_reload_line_parameters_ && window < 8) {
					const int base = (window - 4) << 1;
					assert(base < 7);
					palette_[base] = mapped_colour(ram_[line_parameter_pointer_ + base + 8]);
					palette_[base + 1] = mapped_colour(ram_[line_parameter_pointer_ + base + 9]);
					last_read_ = ram_[line_parameter_pointer_ + base + 9];
				}

				++output_duration_;
				add_window(1);
			}

			if(window >= first_pixel_window_) {
				if(window == first_pixel_window_) {
					set_output_type(is_sync_or_pixels_ ? OutputType::Pixels : OutputType::Border);
				}

				while(window < end_window) {
					int next_event = end_window;
					if(window < left_margin_) next_event = std::min(next_event, left_margin_);
					if(window < right_margin_) next_event = std::min(next_event, right_margin_);

					if(is_sync_or_pixels_) {

#define DispatchBpp(func) \
	switch(bpp_) {	\
		default:	\
		case 1: func(1)(pixel_pointer_, output_duration);	break;	\
		case 2: func(2)(pixel_pointer_, output_duration);	break;	\
		case 4: func(4)(pixel_pointer_, output_duration);	break;	\
		case 8: func(8)(pixel_pointer_, output_duration);	break;	\
	}

#define pixel(x) output_pixel<x, false>
#define lpixel(x) output_pixel<x, true>
#define ch256(x) output_character<x, 8>
#define ch128(x) output_character<x, 7>
#define ch64(x) output_character<x, 6>
#define attr(x) output_attributed<x>

						int columns_remaining = next_event - window;
						while(columns_remaining) {
							if(!pixel_pointer_) {
								if(output_duration_) {
									set_output_type(OutputType::Pixels, true);
								}
								pixel_pointer_ = allocated_pointer_ = reinterpret_cast<uint16_t *>(crt_.begin_data(allocation_size));
							}

							if(allocated_pointer_) {
								const int output_duration = std::min(columns_remaining, int(allocated_pointer_ + allocation_size - pixel_pointer_) / column_size_);

								switch(mode_) {
									default:
									case Mode::Pixel:	DispatchBpp(pixel);		break;
									case Mode::LPixel:	DispatchBpp(lpixel);	break;
									case Mode::CH256:	DispatchBpp(ch256);		break;
									case Mode::CH128:	DispatchBpp(ch128);		break;
									case Mode::CH64:	DispatchBpp(ch64);		break;
									case Mode::Attr:	DispatchBpp(attr);		break;
								}

								pixel_pointer_ += output_duration * column_size_;
								output_duration_ += output_duration;
								if(pixel_pointer_ - allocated_pointer_ == allocation_size) {
									set_output_type(OutputType::Pixels, true);
								}
								columns_remaining -= output_duration;
								add_window(output_duration);
							} else {
								output_duration_ += columns_remaining;
								add_window(columns_remaining);
								columns_remaining = 0;
							}
						}

#undef attr
#undef ch64
#undef ch128
#undef ch256
#undef pixel
#undef lpixel
#undef DispatchBpp
					} else {
						output_duration_ += next_event - window;
						add_window(next_event - window);
					}

					set_output_type(is_sync_or_pixels_ ? OutputType::Pixels : OutputType::Border);
				}
			}
		}

		// Check for end of line.
		if(!horizontal_counter_) {
			assert(window == 57);

			++lines_remaining_;
			if(!lines_remaining_) {
				should_reload_line_parameters_ = true;

				// Check for end-of-frame.
				if(reload_line_parameter_pointer_) {
					line_parameter_pointer_ = line_parameter_base_;
				} else {
					line_parameter_pointer_ += 16;
				}
			} else {
				should_reload_line_parameters_ = false;
			}

			// Deal with VRES and other address reloading, dependant upon mode.
			switch(mode_) {
				default: break;
				case Mode::CH64:
				case Mode::CH128:
				case Mode::CH256:
					line_data_pointer_[0] = start_line_data_pointer_[0];
					++line_data_pointer_[1];
				break;

				case Mode::Pixel:
				case Mode::LPixel:
				case Mode::Attr:
					// Reload the pixel or attribute address if VRES is clear.
					if(!vres_) {
						line_data_pointer_[0] = start_line_data_pointer_[0];
					}
				break;
			}
		}
	}

#undef add_window

}